

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

void __thiscall WorldShuffler::open_random_blocked_path(WorldShuffler *this)

{
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  *this_00;
  WorldPath *path;
  pointer pcVar1;
  Item *item;
  Json *this_01;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  mapped_type_conflict2 *pmVar4;
  ItemSource *pIVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  WorldShuffler *this_02;
  vector<Item_*,_std::allocator<Item_*>_> items_to_place;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> weighted_blocked_paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [32];
  WorldShuffler *local_b8;
  Json *local_b0;
  WorldSolver *local_a8;
  pointer local_a0;
  pointer local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  vector<ItemSource*,std::allocator<ItemSource*>> *local_88;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> local_70;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> local_48;
  
  local_a8 = &this->_solver;
  this_01 = WorldSolver::debug_log_for_current_step_abi_cxx11_(local_a8);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_58,(initializer_list_t)ZEXT816(0),false,array);
  local_b0 = this_01;
  pvVar2 = nlohmann::
           basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this_01,"blockedPaths");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(pvVar2,&local_58);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_58);
  build_weighted_blocked_paths_list(&local_48,this);
  if (local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    path = *local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_b8 = this;
    pvVar2 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)local_b0,"chosenPath");
    pcVar1 = (path->_from_node->_id)._M_dataplus._M_p;
    local_d8._0_8_ = (ItemSource *)(local_d8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,pcVar1,pcVar1 + (path->_from_node->_id)._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8," --> "
              );
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,(path->_to_node->_id)._M_dataplus._M_p,
                       (path->_to_node->_id)._M_string_length);
    local_f8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar7 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == paVar7) {
      local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_f8._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    nlohmann::
    basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::emplace_back<std::__cxx11::string>
              ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)pvVar2,&local_f8);
    this_02 = local_b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_a0 = local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((ItemSource *)local_d8._0_8_ != (ItemSource *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    WorldSolver::missing_items_to_take_path
              ((vector<Item_*,_std::allocator<Item_*>_> *)&local_f8,local_a8,path);
    local_98 = (pointer)local_f8._M_string_length;
    if (local_f8._M_dataplus._M_p != (pointer)local_f8._M_string_length) {
      this_00 = &this_02->_item_pool_quantities;
      local_88 = (vector<ItemSource*,std::allocator<ItemSource*>> *)&this_02->_logical_playthrough;
      _Var6._M_p = local_f8._M_dataplus._M_p;
      do {
        item = *(Item **)_Var6._M_p;
        local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var6._M_p;
        while( true ) {
          local_d8[0] = item->_id;
          pmVar4 = std::
                   map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                   ::operator[](this_00,local_d8);
          if (*pmVar4 == 0) break;
          WorldSolver::empty_reachable_item_sources(&local_70,local_a8);
          pIVar5 = place_item_randomly(this_02,item,&local_70);
          if (local_70.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_70.
                                  super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_70.
                                  super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_d8._0_8_ = pIVar5;
          std::vector<ItemSource*,std::allocator<ItemSource*>>::emplace_back<ItemSource*&>
                    (local_88,(ItemSource **)local_d8);
          this_02 = local_b8;
          local_80.m_type = null;
          local_80.m_value.object = (object_t *)0x0;
          nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
          construct<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (&local_80,&item->_name);
          nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::assert_invariant(&local_80,true);
          pvVar2 = nlohmann::
                   basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)local_b0,"placedKeyItems");
          pvVar2 = nlohmann::
                   basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](pvVar2,(key_type *)(local_d8._0_8_ + 8));
          nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator=(pvVar2,&local_80);
          nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_80);
        }
        _Var6._M_p = local_90->_M_local_buf + 8;
      } while (_Var6._M_p != local_98);
    }
    local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_f8._M_dataplus._M_p,
                      local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
      local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
      super__Vector_impl_data._M_start = local_a0;
    }
  }
  if (local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WorldShuffler::open_random_blocked_path()
{
    Json& debug_log = _solver.debug_log_for_current_step();
    debug_log["blockedPaths"] = Json::array();

    // List all blocked paths, taking weights into account and randomly choose one
    std::vector<WorldPath*> weighted_blocked_paths = this->build_weighted_blocked_paths_list();
    if (weighted_blocked_paths.empty())
        return;
    WorldPath* path_to_open = weighted_blocked_paths[0];
    debug_log["chosenPath"].emplace_back(path_to_open->origin()->id() + " --> " + path_to_open->destination()->id());

    // Place all missing key items for the player to be able to open this blocking path
    std::vector<Item*> items_to_place = _solver.missing_items_to_take_path(path_to_open);
    for(Item* item : items_to_place)
    {
        while(_item_pool_quantities[item->id()] > 0)
        {
            ItemSource* source = this->place_item_randomly(item, _solver.empty_reachable_item_sources());
            _logical_playthrough.emplace_back(source);
            debug_log["placedKeyItems"][source->name()] = item->name();
        }
    }
}